

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

TCGv_i32 gen_dest_gpr(DisasContext_conflict8 *dc,int reg)

{
  int iVar1;
  TCGContext_conflict8 *s;
  TCGTemp *pTVar2;
  TCGv_i32 pTVar3;
  
  if (reg < 1) {
    if (4 < (uint)dc->n_ttl) {
      __assert_fail("dc->n_ttl < ARRAY_SIZE(dc->ttl)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/translate.c"
                    ,0x7c,"TCGv_i64 get_temp_tl(DisasContext *)");
    }
    s = dc->uc->tcg_ctx;
    pTVar2 = tcg_temp_new_internal_sparc64(s,TCG_TYPE_I64,false);
    pTVar3 = (TCGv_i32)((long)pTVar2 - (long)s);
    iVar1 = dc->n_ttl;
    dc->n_ttl = iVar1 + 1;
    dc->ttl[iVar1] = pTVar3;
  }
  else {
    if (0x1f < reg) {
      __assert_fail("reg < 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/translate.c"
                    ,0x140,"TCGv_i64 gen_dest_gpr(DisasContext *, int)");
    }
    pTVar3 = (TCGv_i32)dc->uc->tcg_ctx->cpu_regs[(uint)reg];
  }
  return pTVar3;
}

Assistant:

static inline TCGv gen_dest_gpr(DisasContext *dc, int reg)
{
    if (reg > 0) {
        TCGContext *tcg_ctx = dc->uc->tcg_ctx;
        assert(reg < 32);
        return tcg_ctx->cpu_regs[reg];
    } else {
        return get_temp_tl(dc);
    }
}